

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadImageLibrary(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  allocator local_c9;
  string local_c8;
  Image local_a8;
  allocator local_39;
  undefined1 local_38 [8];
  string id;
  int attrID;
  ColladaParser *this_local;
  
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"image");
        if (bVar1) {
          id.field_2._12_4_ = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)id.field_2._12_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_38,(char *)CONCAT44(extraout_var,iVar3),&local_39);
          std::allocator<char>::~allocator((allocator<char> *)&local_39);
          local_a8.mEmbeddedFormat._M_string_length = 0;
          local_a8.mEmbeddedFormat.field_2._M_allocated_capacity = 0;
          local_a8.mImageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8.mEmbeddedFormat._M_dataplus = (_Alloc_hider)0x0;
          local_a8.mEmbeddedFormat._1_7_ = 0;
          local_a8.mImageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.mImageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.mFileName.field_2._M_allocated_capacity = 0;
          local_a8.mFileName.field_2._8_8_ = 0;
          local_a8.mFileName._M_dataplus = (_Alloc_hider)0x0;
          local_a8.mFileName._1_7_ = 0;
          local_a8.mFileName._M_string_length = 0;
          local_a8.mEmbeddedFormat.field_2._8_8_ = 0;
          Collada::Image::Image(&local_a8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,(key_type *)local_38);
          Collada::Image::operator=(pmVar4,&local_a8);
          Collada::Image::~Image(&local_a8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,(key_type *)local_38);
          ReadImage(this,pmVar4);
          std::__cxx11::string::~string((string *)local_38);
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"library_images");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,"Expected end of <library_images> element.",&local_c9);
      ThrowException(this,&local_c8);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadImageLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_images") != 0)
                ThrowException("Expected end of <library_images> element.");

            break;
        }
    }
}